

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IGUIElement.h
# Opt level: O0

bool __thiscall irr::gui::IGUIElement::sendToBack(IGUIElement *this,IGUIElement *child)

{
  bool bVar1;
  const_iterator __position;
  list<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_> *this_00;
  iterator iVar2;
  long in_RSI;
  long in_RDI;
  list<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_> *in_stack_ffffffffffffff98
  ;
  list<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_> *in_stack_ffffffffffffffa0
  ;
  _List_const_iterator<irr::gui::IGUIElement_*> in_stack_ffffffffffffffc0;
  const_iterator in_stack_ffffffffffffffc8;
  _List_const_iterator<irr::gui::IGUIElement_*> local_28;
  _Self local_20;
  long local_18;
  bool local_1;
  
  if (*(long *)(in_RSI + 0x20) == in_RDI) {
    __position._M_node = (_List_node_base *)(in_RSI + 0x28);
    local_18 = in_RSI;
    local_20._M_node =
         (_List_node_base *)
         ::std::__cxx11::list<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>::
         begin(in_stack_ffffffffffffff98);
    bVar1 = ::std::operator==((_Self *)__position._M_node,&local_20);
    if (bVar1) {
      local_1 = true;
    }
    else {
      this_00 = (list<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_> *)
                (in_RDI + 8);
      ::std::_List_const_iterator<irr::gui::IGUIElement_*>::_List_const_iterator
                (&local_28,(iterator *)(local_18 + 0x28));
      ::std::__cxx11::list<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>::erase
                (in_stack_ffffffffffffffa0,__position);
      iVar2 = ::std::__cxx11::
              list<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>::begin
                        (this_00);
      ::std::_List_const_iterator<irr::gui::IGUIElement_*>::_List_const_iterator
                ((_List_const_iterator<irr::gui::IGUIElement_*> *)&stack0xffffffffffffffc0,
                 (iterator *)&stack0xffffffffffffffb8);
      iVar2 = ::std::__cxx11::
              list<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>::insert
                        (in_stack_ffffffffffffffc0._M_node,in_stack_ffffffffffffffc8,iVar2._M_node);
      *(_List_node_base **)(local_18 + 0x28) = iVar2._M_node;
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

virtual bool sendToBack(IGUIElement *child)
	{
		if (child->Parent != this)
			return false;
		if (child->ParentPos == Children.begin()) // already there
			return true;
		Children.erase(child->ParentPos);
		child->ParentPos = Children.insert(Children.begin(), child);
		return true;
	}